

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  fstream *pfVar1;
  ulong __new_size;
  ssize_t sVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *this_00;
  
  this_00 = (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
            CONCAT44(in_register_00000034,__fd);
  pfVar1 = &this->stream_;
  std::istream::read((char *)pfVar1,
                     (long)(this_00->
                           super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  if (*(int *)(&this->field_0x48 + *(long *)(*(long *)&this->stream_ + -0x18)) != 6) {
    check_stream(this,"read vector");
    return extraout_RAX;
  }
  __new_size = *(ulong *)&this->field_0x30 / 0x38;
  if (*(ulong *)&this->field_0x30 % 0x38 == 0) {
    if (__new_size <=
        (ulong)(((long)(this_00->
                       super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->
                      super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x38)) {
      std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize
                (this_00,__new_size);
      sVar2 = std::ios::clear((int)pfVar1 + (int)*(undefined8 *)(*(long *)pfVar1 + -0x18));
      return sVar2;
    }
    __assert_fail("count / value_size <= vec.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                  ,0xf4,
                  "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeAggregate>::read(std::vector<value_type> &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeAggregate]"
                 );
  }
  __assert_fail("0 == count % value_size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                ,0xf3,
                "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeAggregate>::read(std::vector<value_type> &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeAggregate]"
               );
}

Assistant:

void read(std::vector<value_type>& vec)
    {
        static_assert(std::is_trivially_copyable_v<T>, "T must be a POD.");
        stream_.read(reinterpret_cast<char*>(vec.data()), value_size * vec.size());
        if (stream_.rdstate() == (std::ios_base::failbit | std::ios_base::eofbit))
        {
            // how much did we actually read...
            auto count = stream_.gcount();
            assert(0 == count % value_size);
            assert(count / value_size <= vec.size());
            vec.resize(count / value_size);
            stream_.clear();
        }
        else
        {
            check_stream("read vector");
        }
    }